

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O2

void __thiscall HDual::major_rollback(HDual *this)

{
  int columnIn;
  HModel *pHVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(uint)this->multi_nFinish;
  while (0 < (int)uVar6) {
    pHVar1 = this->model;
    piVar2 = (pHVar1->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2[this->multi_finish[uVar6 - 1].columnIn] = this->multi_finish[uVar6 - 1].moveIn;
    piVar3 = (pHVar1->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[this->multi_finish[uVar6 - 1].columnIn] = 1;
    piVar2[this->multi_finish[uVar6 - 1].columnOut] = 0;
    piVar3[this->multi_finish[uVar6 - 1].columnOut] = 0;
    columnIn = this->multi_finish[uVar6 - 1].columnOut;
    (pHVar1->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[this->multi_finish[uVar6 - 1].rowOut] = columnIn;
    HModel::updateMatrix(pHVar1,columnIn,this->multi_finish[uVar6 - 1].columnIn);
    uVar5 = 0;
    while( true ) {
      piVar2 = this->multi_finish[uVar6 - 1].flipList.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pHVar1 = this->model;
      if ((ulong)((long)this->multi_finish[uVar6 - 1].flipList.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= (ulong)uVar5)
      break;
      HModel::flipBound(pHVar1,piVar2[uVar5]);
      uVar5 = uVar5 + 1;
    }
    pdVar4 = (pHVar1->workShift).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[this->multi_finish[uVar6 - 1].columnIn] = 0.0;
    pdVar4[this->multi_finish[uVar6 - 1].columnOut] = this->multi_finish[uVar6 - 1].shiftOut;
    pHVar1->numberIteration = pHVar1->numberIteration + -1;
    uVar6 = uVar6 - 1;
  }
  return;
}

Assistant:

void HDual::major_rollback() {
    for (int iFn = multi_nFinish - 1; iFn >= 0; iFn--) {
        MFinish *Fin = &multi_finish[iFn];

        // 1. Roll back pivot
        model->getNonbasicMove()[Fin->columnIn] = Fin->moveIn;
        model->getNonbasicFlag()[Fin->columnIn] = 1;
        model->getNonbasicMove()[Fin->columnOut] = 0;
        model->getNonbasicFlag()[Fin->columnOut] = 0;
        model->getBaseIndex()[Fin->rowOut] = Fin->columnOut;

        // 2. Roll back matrix
        model->updateMatrix(Fin->columnOut, Fin->columnIn);

        // 3. Roll back flips
        for (unsigned i = 0; i < Fin->flipList.size(); i++)
            model->flipBound(Fin->flipList[i]);

        // 4. Roll back cost
        model->getWorkShift()[Fin->columnIn] = 0;
        model->getWorkShift()[Fin->columnOut] = Fin->shiftOut;

        // 5. The iteration count
        model->numberIteration--;
    }
}